

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt.cpp
# Opt level: O3

long testSendOnSocket(int count,short port)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  __time_t _Var2;
  __suseconds_t _Var3;
  ostream *poVar4;
  long lVar5;
  int iVar6;
  MemoryStoreFactory factory;
  TestApplication application;
  SessionSettings settings;
  ScreenLogFactory logFactory;
  Symbol symbol;
  ClOrdID clOrdID;
  TransactTime transactTime;
  Side side;
  HandlInst handlInst;
  OrdType ordType;
  SocketAcceptor acceptor;
  SessionID sessionID;
  SocketInitiator initiator;
  stringstream stream;
  NewOrderSingle message;
  code *local_e28;
  Application local_e20;
  int local_e18;
  timeval local_e10;
  undefined1 local_e00 [48];
  Dictionary local_dd0;
  undefined1 local_d70 [64];
  Dictionary local_d30;
  undefined1 local_cd0 [16];
  _Alloc_hider local_cc0;
  char local_cb0 [16];
  _Alloc_hider local_ca0;
  size_type local_c98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c90;
  size_t local_c80;
  int local_c78;
  undefined1 local_c70 [16];
  _Alloc_hider local_c60;
  char local_c50 [16];
  _Alloc_hider local_c40;
  size_type local_c38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c30;
  size_t local_c20;
  int local_c18;
  FieldBase local_c10;
  FieldBase local_bb0;
  FieldBase local_b50;
  FieldBase local_af0;
  string local_a90 [13];
  SessionID local_8f0;
  string local_788 [35];
  stringstream local_310 [16];
  long local_300 [14];
  ios_base local_290 [264];
  NewOrderSingle local_188;
  
  std::__cxx11::stringstream::stringstream(local_310);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_300,"[DEFAULT]",9);
  std::ios::widen((char)*(undefined8 *)(local_300[0] + -0x18));
  std::ostream::put('\0');
  poVar4 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"SocketConnectHost=localhost",0x1b);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  poVar4 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"SocketConnectPort=",0x12);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  poVar4 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"SocketAcceptPort=",0x11);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  poVar4 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"SocketReuseAddress=Y",0x14);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  poVar4 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"StartTime=00:00:00",0x12);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  poVar4 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"EndTime=00:00:00",0x10);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  poVar4 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"UseDataDictionary=N",0x13);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  poVar4 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"BeginString=FIX.4.2",0x13);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  poVar4 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"PersistMessages=N",0x11);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  poVar4 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"[SESSION]",9);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  poVar4 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"ConnectionType=acceptor",0x17);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  poVar4 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"SenderCompID=SERVER",0x13);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  poVar4 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"TargetCompID=CLIENT",0x13);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  poVar4 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"[SESSION]",9);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  poVar4 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"ConnectionType=initiator",0x18);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  poVar4 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"SenderCompID=CLIENT",0x13);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  poVar4 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"TargetCompID=SERVER",0x13);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  poVar4 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"HeartBtInt=30",0xd);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  paVar1 = &local_788[0].field_2;
  local_788[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_788,"ORDERID","");
  local_c70._0_8_ = &PTR__FieldBase_0011c5f8;
  local_c70._8_4_ = 0xb;
  local_c60._M_p = local_c50;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c60,local_788[0]._M_dataplus._M_p,
             local_788[0]._M_dataplus._M_p + local_788[0]._M_string_length);
  local_c40._M_p = (pointer)&local_c30;
  local_c38 = 0;
  local_c30._M_local_buf[0] = '\0';
  local_c20 = 0;
  local_c18 = 0;
  local_c70._0_8_ = &PTR__FieldBase_0011c678;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_788[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_788[0]._M_dataplus._M_p,local_788[0].field_2._M_allocated_capacity + 1);
  }
  FIX::CharField::CharField((CharField *)&local_b50,0x15,'1');
  local_b50._vptr_FieldBase = (_func_int **)&PTR__FieldBase_0011c6b0;
  local_788[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_788,"LNUX","");
  local_cd0._0_8_ = &PTR__FieldBase_0011c5f8;
  local_cd0._8_4_ = 0x37;
  local_cc0._M_p = local_cb0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_cc0,local_788[0]._M_dataplus._M_p,
             local_788[0]._M_dataplus._M_p + local_788[0]._M_string_length);
  local_ca0._M_p = (pointer)&local_c90;
  local_c98 = 0;
  local_c90._M_local_buf[0] = '\0';
  local_c80 = 0;
  local_c78 = 0;
  local_cd0._0_8_ = &PTR__FieldBase_0011c720;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_788[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_788[0]._M_dataplus._M_p,local_788[0].field_2._M_allocated_capacity + 1);
  }
  FIX::CharField::CharField((CharField *)&local_bb0,0x36,'1');
  local_bb0._vptr_FieldBase = (_func_int **)&PTR__FieldBase_0011c758;
  FIX::UtcTimeStampField::UtcTimeStampField((UtcTimeStampField *)&local_c10,0x3c,0);
  local_c10._vptr_FieldBase = (_func_int **)&PTR__FieldBase_0011c790;
  FIX::CharField::CharField((CharField *)&local_af0,0x28,'1');
  local_af0._vptr_FieldBase = (_func_int **)&PTR__FieldBase_0011c848;
  FIX42::NewOrderSingle::NewOrderSingle
            (&local_188,(ClOrdID *)local_c70,(HandlInst *)&local_b50,(Symbol *)local_cd0,
             (Side *)&local_bb0,(TransactTime *)&local_c10,(OrdType *)&local_af0);
  local_788[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_788,"FIX.4.2","");
  local_a90[0]._M_dataplus._M_p = (pointer)&local_a90[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a90,"CLIENT","");
  local_d70._0_8_ = local_d70 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d70,"SERVER","");
  local_e00._0_8_ = local_e00 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e00,"");
  FIX::SessionID::SessionID(&local_8f0,local_788,local_a90,(string *)local_d70,(string *)local_e00);
  if ((undefined1 *)local_e00._0_8_ != local_e00 + 0x10) {
    operator_delete((void *)local_e00._0_8_,local_e00._16_8_ + 1);
  }
  if ((undefined1 *)local_d70._0_8_ != local_d70 + 0x10) {
    operator_delete((void *)local_d70._0_8_,local_d70._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a90[0]._M_dataplus._M_p != &local_a90[0].field_2) {
    operator_delete(local_a90[0]._M_dataplus._M_p,local_a90[0].field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_788[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_788[0]._M_dataplus._M_p,local_788[0].field_2._M_allocated_capacity + 1);
  }
  local_e20._vptr_Application = (_func_int **)&PTR__Application_0011ccb8;
  local_e18 = 0;
  local_e28 = FIX::FieldMap::FieldMap;
  FIX::SessionSettings::SessionSettings((SessionSettings *)local_e00,(istream *)local_310,false);
  FIX::ScreenLogFactory::ScreenLogFactory
            ((ScreenLogFactory *)local_d70,(SessionSettings *)local_e00);
  FIX::SocketAcceptor::SocketAcceptor
            ((SocketAcceptor *)local_a90,&local_e20,(MessageStoreFactory *)&local_e28,
             (SessionSettings *)local_e00);
  FIX::Acceptor::start();
  FIX::SocketInitiator::SocketInitiator
            ((SocketInitiator *)local_788,&local_e20,(MessageStoreFactory *)&local_e28,
             (SessionSettings *)local_e00);
  FIX::Initiator::start();
  FIX::process_sleep(1.0);
  gettimeofday(&local_e10,(__timezone_ptr_t)0x0);
  _Var3 = local_e10.tv_usec;
  _Var2 = local_e10.tv_sec;
  if (-1 < count) {
    iVar6 = count + 1;
    do {
      FIX::Session::sendToTarget((Message *)&local_188,&local_8f0);
      iVar6 = iVar6 + -1;
    } while (iVar6 != 0);
  }
  while (local_e18 < count) {
    FIX::process_sleep(0.1);
  }
  gettimeofday(&local_e10,(__timezone_ptr_t)0x0);
  FIX::Initiator::stop(SUB81(local_788,0));
  FIX::Acceptor::stop(SUB81(local_a90,0));
  FIX::SocketInitiator::~SocketInitiator((SocketInitiator *)local_788);
  FIX::SocketAcceptor::~SocketAcceptor((SocketAcceptor *)local_a90);
  local_d70._0_8_ = atoi;
  FIX::Dictionary::~Dictionary(&local_d30);
  std::
  _Rb_tree<FIX::SessionID,_std::pair<const_FIX::SessionID,_FIX::Dictionary>,_std::_Select1st<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>_>
  ::~_Rb_tree((_Rb_tree<FIX::SessionID,_std::pair<const_FIX::SessionID,_FIX::Dictionary>,_std::_Select1st<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>_>
               *)(local_d70 + 0x10));
  FIX::Dictionary::~Dictionary(&local_dd0);
  std::
  _Rb_tree<FIX::SessionID,_std::pair<const_FIX::SessionID,_FIX::Dictionary>,_std::_Select1st<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>_>
  ::~_Rb_tree((_Rb_tree<FIX::SessionID,_std::pair<const_FIX::SessionID,_FIX::Dictionary>,_std::_Select1st<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>_>
               *)local_e00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8f0.m_frozenString._M_dataplus._M_p != &local_8f0.m_frozenString.field_2) {
    operator_delete(local_8f0.m_frozenString._M_dataplus._M_p,
                    local_8f0.m_frozenString.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8f0.m_sessionQualifier._M_dataplus._M_p != &local_8f0.m_sessionQualifier.field_2) {
    operator_delete(local_8f0.m_sessionQualifier._M_dataplus._M_p,
                    local_8f0.m_sessionQualifier.field_2._M_allocated_capacity + 1);
  }
  lVar5 = SUB168(SEXT816(_Var3) * SEXT816(-0x20c49ba5e353f7cf),8);
  FIX::FieldBase::~FieldBase((FieldBase *)&local_8f0.m_targetCompID);
  FIX::FieldBase::~FieldBase((FieldBase *)&local_8f0.m_senderCompID);
  FIX::FieldBase::~FieldBase((FieldBase *)&local_8f0);
  FIX::Message::~Message((Message *)&local_188);
  FIX::FieldBase::~FieldBase(&local_af0);
  FIX::FieldBase::~FieldBase(&local_c10);
  FIX::FieldBase::~FieldBase(&local_bb0);
  FIX::FieldBase::~FieldBase((FieldBase *)local_cd0);
  FIX::FieldBase::~FieldBase(&local_b50);
  FIX::FieldBase::~FieldBase((FieldBase *)local_c70);
  std::__cxx11::stringstream::~stringstream(local_310);
  std::ios_base::~ios_base(local_290);
  return (local_e10.tv_sec - _Var2) * 1000 +
         ((lVar5 >> 7) - (lVar5 >> 0x3f)) + local_e10.tv_usec / 1000;
}

Assistant:

long testSendOnSocket( int count, short port )
{
  std::stringstream stream;
  stream
    << "[DEFAULT]" << std::endl
    << "SocketConnectHost=localhost" << std::endl
    << "SocketConnectPort=" << (unsigned short)port << std::endl
    << "SocketAcceptPort=" << (unsigned short)port << std::endl
    << "SocketReuseAddress=Y" << std::endl
    << "StartTime=00:00:00" << std::endl
    << "EndTime=00:00:00" << std::endl
    << "UseDataDictionary=N" << std::endl
    << "BeginString=FIX.4.2" << std::endl
    << "PersistMessages=N" << std::endl
    << "[SESSION]" << std::endl
    << "ConnectionType=acceptor" << std::endl
    << "SenderCompID=SERVER" << std::endl
    << "TargetCompID=CLIENT" << std::endl
    << "[SESSION]" << std::endl
    << "ConnectionType=initiator" << std::endl
    << "SenderCompID=CLIENT" << std::endl
    << "TargetCompID=SERVER" << std::endl
    << "HeartBtInt=30" << std::endl;

  FIX::ClOrdID clOrdID( "ORDERID" );
  FIX::HandlInst handlInst( '1' );
  FIX::Symbol symbol( "LNUX" );
  FIX::Side side( FIX::Side_BUY );
  FIX::TransactTime transactTime;
  FIX::OrdType ordType( FIX::OrdType_MARKET );
  FIX42::NewOrderSingle message( clOrdID, handlInst, symbol, side, transactTime, ordType );

  FIX::SessionID sessionID( "FIX.4.2", "CLIENT", "SERVER" );

  TestApplication application;
  FIX::MemoryStoreFactory factory;
  FIX::SessionSettings settings( stream );
  FIX::ScreenLogFactory logFactory( settings );

  FIX::SocketAcceptor acceptor( application, factory, settings );
  acceptor.start();

  FIX::SocketInitiator initiator( application, factory, settings );
  initiator.start();

  FIX::process_sleep( 1 );

  long start = GetTickCount();

  for ( int i = 0; i <= count; ++i )
    FIX::Session::sendToTarget( message, sessionID );

  while( application.getCount() < count )
    FIX::process_sleep( 0.1 );

  long ticks = GetTickCount() - start;

  initiator.stop();
  acceptor.stop();

  return ticks;
}